

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O3

int ngp_read_group(fitsfile *ff,char *grpname,int parent_hn)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong __n;
  int my_hn;
  int tmp0;
  NGP_HDU ngph;
  char incrementor_name [80];
  char grnm [80];
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  NGP_HDU local_e8;
  char local_d8 [80];
  char local_88 [79];
  undefined1 local_39;
  
  local_d8[0] = '\0';
  ngp_grplevel = ngp_grplevel + 1;
  local_e8.tok = (NGP_TOKEN *)0x0;
  local_e8.tokcnt = 0;
  local_f8 = 0;
  local_f8 = ffgtcr(ff,grpname,0,&local_f8);
  if (local_f8 == 0) {
    ffghdn(ff,&local_f4);
    if (0 < parent_hn) {
      ffmahd(ff,parent_hn,&local_ec,&local_f8);
      ffgtam(ff,(fitsfile *)0x0,local_f4,&local_f8);
      ffmahd(ff,local_f4,&local_ec,&local_f8);
      if (local_f8 != 0) {
        return local_f8;
      }
    }
    local_f0 = 6;
    do {
      local_f8 = ngp_read_line(0);
      if (local_f8 != 0) break;
      switch(ngp_keyidx) {
      case 1:
        if (ngp_linkey.type == 2) {
          strncpy(local_88,ngp_linkey.value.s,0x50);
        }
        else {
          master_grp_idx = master_grp_idx + 1;
          snprintf(local_88,0x50,"DEFAULT_GROUP_%d");
        }
        local_39 = 0;
        local_f8 = ngp_read_group(ff,local_88,local_f4);
        break;
      case 2:
        ngp_grplevel = ngp_grplevel + -1;
        goto LAB_00174722;
      case 3:
        if (ngp_curline.line == (char *)0x0) {
          local_f8 = 0x16b;
          goto LAB_00174722;
        }
        if (ngp_prevline.line != (char *)0x0) {
          local_f8 = 0x16c;
          goto LAB_00174722;
        }
        ngp_prevline.comment = ngp_curline.comment;
        ngp_prevline.format = ngp_curline.format;
        ngp_prevline.flags = ngp_curline.flags;
        ngp_prevline.value = ngp_curline.value;
        ngp_prevline.type = ngp_curline.type;
        ngp_prevline._28_4_ = ngp_curline._28_4_;
        ngp_prevline.line = ngp_curline.line;
        ngp_prevline.name = ngp_curline.name;
        ngp_curline.line = (char *)0x0;
        local_f8 = 0;
        local_f8 = ngp_read_xtension(ff,local_f4,0);
        break;
      case 4:
      case 5:
        local_f8 = 0x171;
        goto LAB_00174722;
      default:
        sVar3 = strlen(ngp_linkey.name);
        iVar1 = (int)sVar3;
        if (iVar1 - 2U < 5) {
          __n = (ulong)(iVar1 - 1U);
          if (ngp_linkey.name[__n] == '#') {
            if (local_d8[0] == '\0') {
              memcpy(local_d8,ngp_linkey.name,__n);
              local_d8[__n] = '\0';
            }
            sVar4 = strlen(local_d8);
            if (iVar1 - 1U == (uint)sVar4) {
              iVar2 = bcmp(local_d8,ngp_linkey.name,__n);
              local_f0 = local_f0 + (uint)(iVar2 == 0);
            }
            snprintf(ngp_linkey.name + ((sVar3 & 0xffffffff) - 1),(ulong)(0x4c - iVar1),"%d");
          }
        }
        local_f8 = ngp_hdu_insert_token(&local_e8,&ngp_linkey);
      }
    } while (local_f8 == 0);
LAB_00174722:
    ffmahd(ff,local_f4,&local_ec,&local_f8);
    if (((local_f8 != 0) || (local_f8 = ngp_append_columns(ff,&local_e8,6), local_f8 != 0)) ||
       (local_f8 = ngp_keyword_all_write(&local_e8,ff,0), local_f8 != 0)) {
      local_ec = 0;
      ffgtrm(ff,0,&local_ec);
    }
    ngp_hdu_clear(&local_e8);
  }
  return local_f8;
}

Assistant:

int	ngp_read_group(fitsfile *ff, char *grpname, int parent_hn)
 { int		r, exitflg, l, my_hn, tmp0, incrementor_index;
   char		grnm[NGP_MAX_STRING];			/* keyword holding group name */
   char		incrementor_name[NGP_MAX_STRING];
   NGP_HDU	ngph;

   incrementor_name[0] = 0;			/* signal no keyword+'#' found yet */
   incrementor_index = 6;			/* first 6 cols are used by group */

   ngp_grplevel++;
   if (NGP_OK != (r = ngp_hdu_init(&ngph))) return(r);

   r = NGP_OK;
   if (NGP_OK != (r = fits_create_group(ff, grpname, GT_ID_ALL_URI, &r))) return(r);
   fits_get_hdu_num(ff, &my_hn);
   if (parent_hn > 0)
     { fits_movabs_hdu(ff, parent_hn, &tmp0, &r);	/* link us to parent */
       fits_add_group_member(ff, NULL, my_hn, &r);
       fits_movabs_hdu(ff, my_hn, &tmp0, &r);
       if (NGP_OK != r) return(r);
     }

   for (exitflg = 0; 0 == exitflg;)
    { if (NGP_OK != (r = ngp_read_line(0))) break;	/* EOF always means error here */
      switch (ngp_keyidx)
       {
	 case NGP_TOKEN_SIMPLE:
	 case NGP_TOKEN_EOF:
			r = NGP_TOKEN_NOT_EXPECT;
			break;

         case NGP_TOKEN_END:
         		ngp_grplevel--;
			exitflg = 1;
			break;

         case NGP_TOKEN_GROUP:
			if (NGP_TTYPE_STRING == ngp_linkey.type)
			  { strncpy(grnm, ngp_linkey.value.s, NGP_MAX_STRING);
			  }
			else
			  { snprintf(grnm, NGP_MAX_STRING,"DEFAULT_GROUP_%d", master_grp_idx++);
			  }
			grnm[NGP_MAX_STRING - 1] = 0;
			r = ngp_read_group(ff, grnm, my_hn);
			break;			/* we can have many subsequent GROUP defs */

         case NGP_TOKEN_XTENSION:
         		r = ngp_unread_line();
         		if (NGP_OK != r) break;
         		r = ngp_read_xtension(ff, my_hn, 0);
			break;			/* we can have many subsequent HDU defs */

         default:	l = strlen(ngp_linkey.name);
			if ((l >= 2) && (l <= 6))
			  { if ('#' == ngp_linkey.name[l - 1])
			      { if (0 == incrementor_name[0])
			          { memcpy(incrementor_name, ngp_linkey.name, l - 1);
			            incrementor_name[l - 1] = 0;
			          }
			        if (((l - 1) == (int)strlen(incrementor_name)) && (0 == memcmp(incrementor_name, ngp_linkey.name, l - 1)))
			          { incrementor_index++;
			          }
			        snprintf(ngp_linkey.name + l - 1, NGP_MAX_NAME-l+1,"%d", incrementor_index);
			      }
			  }
         		r = ngp_hdu_insert_token(&ngph, &ngp_linkey); 
			break;			/* here we can add keyword */
       }
      if (NGP_OK != r) break;
    }

   fits_movabs_hdu(ff, my_hn, &tmp0, &r);	/* back to our HDU */

   if (NGP_OK == r)				/* create additional columns, if requested */
     r = ngp_append_columns(ff, &ngph, 6);

   if (NGP_OK == r)				/* and write keywords */
     r = ngp_keyword_all_write(&ngph, ff, NGP_NON_SYSTEM_ONLY);

   if (NGP_OK != r)			/* delete group in case of error */
     { tmp0 = 0;
       fits_remove_group(ff, OPT_RM_GPT, &tmp0);
     }

   ngp_hdu_clear(&ngph);		/* we are done with this HDU, so delete it */
   return(r);
 }